

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::tryUnitPartitioning(string *unit_string,uint64_t match_flags)

{
  byte bVar1;
  pointer pcVar2;
  string *unit;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  precise_unit pVar5;
  _Alloc_hider _Var6;
  uint32_t uVar7;
  pointer pbVar8;
  char cVar9;
  unit_data uVar10;
  undefined8 uVar11;
  size_type sVar12;
  double dVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  bool bVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  pointer pbVar20;
  ulong extraout_XMM0_Qb;
  double dVar21;
  pair<double,_unsigned_long> pVar22;
  precise_unit pVar23;
  precise_unit pVar24;
  size_t part;
  precise_unit res;
  string ustring;
  precise_unit bunit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid;
  double local_228;
  size_t local_220;
  double local_218;
  undefined1 local_210 [12];
  uint uStack_204;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  double local_1f0;
  value_type local_1e8;
  precise_unit local_1c8;
  double local_1b8;
  double local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  string local_188;
  string local_168;
  pointer local_148;
  ulong uStack_140;
  string local_138;
  ulong local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar2 = (unit_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + unit_string->_M_string_length);
  unit = (string *)(unit_string->_M_dataplus)._M_p;
  pVar22 = getPrefixMultiplierWord(unit);
  local_228 = pVar22.first;
  if ((local_228 != 0.0) || (NAN(local_228))) {
    std::__cxx11::string::substr((ulong)local_210,(ulong)unit_string);
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    pVar23 = unit_from_string_internal(&local_b0,match_flags);
    dVar13 = pVar23._8_8_;
    dVar21 = pVar23.multiplier_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      local_1f0 = pVar23.multiplier_;
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      dVar21 = local_1f0;
    }
    if (pVar23.base_units_ == (unit_data)0xfa94a488 && NAN(dVar21)) {
      dVar13 = 2.07707442941207e-314;
      local_228 = NAN;
    }
    else {
      local_228 = local_228 * dVar21;
    }
    goto LAB_00172488;
  }
  local_220 = (ulong)(*(char *)&(unit->_M_dataplus)._M_p != 'N') * 2 + 1;
  std::__cxx11::string::substr((ulong)local_210,(ulong)unit_string);
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != &local_200) {
    operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
  }
  bVar1 = local_1e8._M_dataplus._M_p[local_1e8._M_string_length - 1];
  if (((bVar1 == 0x28) || (bVar1 == 0x7b)) || (bVar1 == 0x5b)) {
    local_220 = 1;
    std::__cxx11::string::pop_back();
  }
  dVar13 = (double)(ulong)((uint)(match_flags >> 0x25) & 7);
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = (double)match_flags;
  if ((ulong)dVar13 <= unit_string->_M_string_length - local_220 &&
      local_220 < unit_string->_M_string_length - 1) {
    local_118 = match_flags | 0x400000000;
    local_228 = NAN;
    bVar18 = false;
    local_218 = 2.07707442941207e-314;
    local_1b0 = dVar13;
    do {
      if ((ulong)dVar13 <= local_1e8._M_string_length) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_1e8._M_dataplus._M_p,
                   local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
        _local_210 = unit_quick_match(&local_168,(uint64_t)local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        auVar3 = local_210;
        if (((NAN(local_210._0_8_)) && (local_210._8_4_ == -0x56b5b78)) &&
           (2 < local_1e8._M_string_length)) {
          auVar4._8_8_ = 0xfa94a488;
          auVar4._0_8_ = local_210._0_8_;
          auVar3 = auVar4._0_12_;
          if ((byte)(*local_1e8._M_dataplus._M_p + 0xbfU) < 0x1a) {
            *local_1e8._M_dataplus._M_p = *local_1e8._M_dataplus._M_p | 0x20;
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_188,local_1e8._M_dataplus._M_p,
                       local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
            _local_210 = unit_quick_match(&local_188,(uint64_t)local_1f0);
            auVar3 = local_210;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
              auVar3 = local_210;
            }
          }
        }
        if ((!NAN(auVar3._0_8_)) || (auVar3._8_4_ != -0x56b5b78)) {
          std::__cxx11::string::substr((ulong)&local_110,(ulong)unit_string);
          local_1c8 = unit_from_string_internal(&local_110,local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          local_1b8 = local_1c8.multiplier_;
          if ((!NAN(local_1b8)) || (local_1c8.base_units_ != -0x56b5b78)) {
            local_148 = (pointer)local_210._0_8_;
            if ((NAN(local_228)) && (local_218._0_4_ == -0x56b5b78)) {
              uVar10 = detail::unit_data::operator*
                                 ((unit_data *)(local_210 + 8),&local_1c8.base_units_);
              local_228 = local_1b8 * (double)local_148;
              local_218 = (double)CONCAT44(local_1c8.commodity_ | uStack_204,uVar10);
            }
            else {
              uVar10 = detail::unit_data::operator*
                                 ((unit_data *)(local_210 + 8),&local_1c8.base_units_);
              uVar14 = uStack_204;
              uVar7 = local_1c8.commodity_;
              local_1b8 = local_1b8 * (double)local_148;
              dVar13 = log10(local_1b8);
              local_148 = (pointer)((ulong)dVar13 & 0x7fffffffffffffff);
              uStack_140 = extraout_XMM0_Qb & 0x7fffffffffffffff;
              dVar13 = log10(local_228);
              if ((double)local_148 < ABS(dVar13)) {
                local_218 = (double)CONCAT44(uVar7 | uVar14,uVar10);
                local_228 = local_1b8;
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1a8,&local_1e8);
        }
      }
      cVar16 = (char)&local_1e8;
      std::__cxx11::string::push_back(cVar16);
      sVar12 = local_1e8._M_string_length;
      _Var6._M_p = local_1e8._M_dataplus._M_p;
      uVar15 = local_220 + 1;
      bVar1 = local_1e8._M_dataplus._M_p[local_1e8._M_string_length - 1];
      local_220 = uVar15;
      if (((bVar1 == 0x28) || (bVar1 == 0x7b)) || (dVar13 = local_1b0, bVar1 == 0x5b)) {
        cVar9 = getMatchCharacter(bVar1);
        segmentcheck(unit_string,cVar9,&local_220);
        if ((_Var6._M_p[sVar12 - 1] == 0x28) &&
           (uVar15 = std::__cxx11::string::find_first_of((char *)unit_string,0x1871d0,uVar15),
           dVar13 = local_1b0, uVar15 < local_220)) goto LAB_00171f7c;
        dVar13 = local_1b0;
        std::__cxx11::string::substr((ulong)local_210,(ulong)unit_string);
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._0_8_ != &local_200) {
          operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
        }
      }
      while ((bVar1 = local_1e8._M_dataplus._M_p[local_1e8._M_string_length - 1], bVar1 == 0x2d ||
             (bVar1 == 0x5f))) {
        sVar12 = unit_string->_M_string_length;
        if (sVar12 - 1 <= local_220) goto LAB_00171f1b;
        std::__cxx11::string::push_back(cVar16);
        bVar18 = true;
        local_220 = local_220 + 1;
      }
      sVar12 = unit_string->_M_string_length;
LAB_00171f1b:
      if ((byte)(bVar1 - 0x30) < 10) {
        for (; (local_220 < sVar12 - 1 &&
               (cVar9 = (unit_string->_M_dataplus)._M_p[local_220],
               cVar9 == '.' || (byte)(cVar9 - 0x30U) < 10)); local_220 = local_220 + 1) {
          std::__cxx11::string::push_back(cVar16);
          sVar12 = unit_string->_M_string_length;
        }
      }
      if ((sVar12 - 1 <= local_220) || (sVar12 - local_220 < (ulong)dVar13)) goto LAB_00171f7c;
    } while( true );
  }
  local_228 = NAN;
  bVar18 = false;
  local_218 = 2.07707442941207e-314;
LAB_00171f7c:
  pVar5._8_8_ = local_218;
  pVar5.multiplier_ = local_228;
  pVar23._8_8_ = local_218;
  pVar23.multiplier_ = local_228;
  if ((NAN(local_228)) && (pVar23 = pVar5, local_218._0_4_ == -0x56b5b78)) {
    uVar14 = SUB84(dVar13,0);
    if (uVar14 < 2) {
      if ((unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] != 'm') {
LAB_0017206d:
        if (!bVar18) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)unit_string);
          pVar23 = unit_quick_match(&local_50,(uint64_t)local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pbVar8 = local_1a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pVar23._8_8_ & 0xffffffff) == 0xfa94a488 && NAN(pVar23.multiplier_)) {
            if (unit_string->_M_string_length == 4) {
              std::__cxx11::string::substr((ulong)&local_70,(ulong)unit_string);
              dVar13 = local_1f0;
              local_1c8 = unit_quick_match(&local_70,(uint64_t)local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::substr((ulong)&local_90,(ulong)unit_string);
              _local_210 = unit_from_string_internal(&local_90,(uint64_t)dVar13);
              uVar15 = local_210._8_8_;
              dVar13 = local_210._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((uVar15 & 0xffffffff) != 0xfa94a488 || !NAN(dVar13)) {
                pVar23 = precise_unit::operator*(&local_1c8,(precise_unit *)local_210);
                goto LAB_00172471;
              }
            }
          }
          else {
            std::__cxx11::string::substr((ulong)local_210,(ulong)unit_string);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_insert_rval(&local_1a8,(const_iterator)pbVar8,(value_type *)local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._0_8_ != &local_200) {
              operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
            }
          }
        }
        pbVar8 = local_1a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((uVar14 < 2) &&
           ((cVar16 = *(unit_string->_M_dataplus)._M_p, cVar16 == 'V' || (cVar16 == 'A')))) {
          std::__cxx11::string::substr((ulong)local_210,(ulong)unit_string);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_rval(&local_1a8,(const_iterator)pbVar8,(value_type *)local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._0_8_ != &local_200) {
            operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
          }
        }
        goto LAB_001722a2;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_1e8._M_dataplus._M_p,
                 local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
      _local_210 = unit_quick_match(&local_d0,(uint64_t)local_1f0);
      uVar15 = local_210._8_8_;
      local_228 = local_210._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((uVar15 & 0xffffffff) == 0xfa94a488 && NAN(local_228)) goto LAB_0017206d;
      uVar10 = detail::unit_data::operator*
                         ((unit_data *)(local_210 + 8),(unit_data *)((long)&m + 4));
      uVar11 = CONCAT44(uStack_204,uVar10);
    }
    else {
      if (uVar14 == 2) goto LAB_0017206d;
LAB_001722a2:
      dVar13 = local_1f0;
      pbVar17 = local_1a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      pbVar19 = local_1a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start < pbVar17 &&
          local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__cxx11::string::swap((string *)pbVar19);
          pbVar19 = pbVar19 + 1;
          pbVar17 = pbVar17 + -1;
        } while (pbVar19 < pbVar17);
      }
      pbVar8 = local_1a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_228 = NAN;
      if (local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_218 = (double)((ulong)dVar13 | 0x6000000000);
        pbVar20 = local_1a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          pcVar2 = (pbVar20->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,pcVar2,pcVar2 + pbVar20->_M_string_length);
          _local_210 = unit_quick_match(&local_138,(uint64_t)dVar13);
          local_1b8 = local_210._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          uVar15 = pbVar20->_M_string_length;
          std::__cxx11::string::substr((ulong)&local_f0,(ulong)unit_string);
          dVar13 = local_1f0;
          if (uVar15 < 4) {
            dVar13 = local_218;
          }
          pVar23 = unit_from_string_internal(&local_f0,(uint64_t)dVar13);
          local_1b0 = pVar23.multiplier_;
          local_1c8 = pVar23;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((!NAN(local_1b0)) || (pVar23.base_units_ != (unit_data)0xfa94a488)) {
            uVar10 = detail::unit_data::operator*
                               ((unit_data *)(local_210 + 8),&local_1c8.base_units_);
            pVar23.commodity_ = local_1c8.commodity_ | uStack_204;
            pVar23.base_units_ = uVar10;
            pVar23.multiplier_ = local_1b0 * local_1b8;
            goto LAB_00172471;
          }
          pbVar20 = pbVar20 + 1;
          dVar13 = local_1f0;
        } while (pbVar20 != pbVar8);
      }
      uVar11 = 0xfa94a488;
    }
    pVar23.base_units_ = (unit_data)(int)uVar11;
    pVar23.commodity_ = (int)((ulong)uVar11 >> 0x20);
    pVar23.multiplier_ = local_228;
  }
LAB_00172471:
  local_218 = pVar23._8_8_;
  local_228 = pVar23.multiplier_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  dVar13 = local_218;
LAB_00172488:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pVar24.base_units_ = (unit_data)SUB84(dVar13,0);
  pVar24.commodity_ = (int)((ulong)dVar13 >> 0x20);
  pVar24.multiplier_ = local_228;
  return pVar24;
}

Assistant:

static precise_unit tryUnitPartitioning(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    std::string ustring = unit_string;

    auto mret = getPrefixMultiplierWord(unit_string);
    if (mret.first != 0.0) {
        ustring = unit_string.substr(mret.second);

        auto retunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(retunit)) {
            return {mret.first, retunit};
        }
        return precise::invalid;
    }

    // a newton(N) in front is somewhat common
    // try a round with just a quick partition
    size_t part = (unit_string.front() == 'N') ? 1 : 3;
    ustring = unit_string.substr(0, part);
    if (ustring.back() == '(' || ustring.back() == '[' ||
        ustring.back() == '{') {
        part = 1;
        ustring.pop_back();
    }
    auto minPartitionSize = getMinPartitionSize(match_flags);
    std::vector<std::string> valid;
    precise_unit possible = precise::invalid;
    bool hasSep{false};
    while (part < unit_string.size() - 1) {
        if (unit_string.size() - part < minPartitionSize) {
            break;
        }
        if (ustring.size() >= minPartitionSize) {
            auto res = unit_quick_match(ustring, match_flags);
            if (!is_valid(res) && ustring.size() >= 3) {
                if (ustring.front() >= 'A' &&
                    ustring.front() <= 'Z') {  // check the lower case version
                                               // since we skipped partitioning
                                               // when we did this earlier
                    ustring[0] += 32;
                    res = unit_quick_match(ustring, match_flags);
                }
            }
            if (is_valid(res)) {
                auto bunit = unit_from_string_internal(
                    unit_string.substr(part),
                    match_flags | skip_partition_check);
                if (is_valid(bunit)) {
                    if (!is_valid(possible)) {
                        possible = res * bunit;
                    } else {
                        auto temp = res * bunit;
                        if (std::abs(log10(temp.multiplier())) <
                            std::abs(log10(possible.multiplier()))) {
                            possible = temp;
                        }
                    }
                }
                valid.push_back(ustring);
            }
        }
        ustring.push_back(unit_string[part]);
        ++part;
        if (ustring.back() == '(' || ustring.back() == '[' ||
            ustring.back() == '{') {
            auto start = part;
            segmentcheck(unit_string, getMatchCharacter(ustring.back()), part);
            if (ustring.back() == '(') {
                if (unit_string.find_first_of("({[*/", start) < part) {
                    // this implies that the contents of the parenthesis
                    // must be a standalone segment and should not be
                    // included in a check
                    break;
                }
            }
            ustring = unit_string.substr(0, part);
        }
        while ((ustring.back() == '_' || ustring.back() == '-') &&
               (part < unit_string.size() - 1)) {
            hasSep = true;
            ustring.push_back(unit_string[part]);
            ++part;
        }
        if (isDigitCharacter(ustring.back())) {
            while ((part < unit_string.size() - 1) &&
                   (unit_string[part] == '.' ||
                    isDigitCharacter(unit_string[part]))) {
                ustring.push_back(unit_string[part]);
                ++part;
            }
        }
    }
    if (is_valid(possible)) {
        return possible;
    }
    if (minPartitionSize <= 1) {
        // meter is somewhat common ending so just check that one too
        if (unit_string.back() == 'm') {
            auto res = unit_quick_match(ustring, match_flags);
            if (is_valid(res)) {
                return res * m;
            }
        }
    }
    if (minPartitionSize <= 2 && !hasSep) {
        // now do a quick check with a 2 character string since we skipped that
        // earlier
        auto qm2 = unit_quick_match(unit_string.substr(0, 2), match_flags);
        if (is_valid(qm2)) {
            valid.insert(valid.begin(), unit_string.substr(0, 2));
        } else if (unit_string.size() == 4) {  // length of 4 is a bit odd so
                                               // check the back two characters
                                               // for a quick match
            qm2 = unit_quick_match(unit_string.substr(2, 2), match_flags);
            auto bunit = unit_from_string_internal(
                unit_string.substr(0, 2), match_flags);
            if (is_valid(bunit)) {
                return qm2 * bunit;
            }
        }
    }
    if (minPartitionSize <= 1) {
        // now pick off a couple 1 character units
        if (unit_string.front() == 'V' || unit_string.front() == 'A') {
            valid.insert(valid.begin(), unit_string.substr(0, 1));
        }
    }
    // start with the biggest
    std::reverse(valid.begin(), valid.end());
    for (auto& vd : valid) {
        auto res = unit_quick_match(vd, match_flags);
        auto nmatch_flags = (vd.size() > 3) ?
            match_flags :
            match_flags | minimum_partition_size3;
        auto bunit = unit_from_string_internal(
            unit_string.substr(vd.size()), nmatch_flags);
        if (is_valid(bunit)) {
            return res * bunit;
        }
    }

    return precise::invalid;
}